

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenBuffer.cpp
# Opt level: O1

void __thiscall TokenBuffer::syncConsume(TokenBuffer *this)

{
  int iVar1;
  iterator __position;
  
  if (0 < this->numToConsume) {
    do {
      if (this->nMarkers < 1) {
        __position._M_current =
             (this->queue).storage.
             super__Vector_base<RefCount<Token>,_std::allocator<RefCount<Token>_>_>._M_impl.
             super__Vector_impl_data._M_start;
        if ((this->queue).storage.
            super__Vector_base<RefCount<Token>,_std::allocator<RefCount<Token>_>_>._M_impl.
            super__Vector_impl_data._M_finish != __position._M_current) {
          std::vector<RefCount<Token>,_std::allocator<RefCount<Token>_>_>::_M_erase
                    (&(this->queue).storage,__position);
        }
      }
      else {
        this->markerOffset = this->markerOffset + 1;
      }
      iVar1 = this->numToConsume;
      this->numToConsume = iVar1 + -1;
    } while (1 < iVar1);
  }
  return;
}

Assistant:

void TokenBuffer::syncConsume()
{
	while (numToConsume > 0) {
		if (nMarkers > 0) {
			// guess mode -- leave leading tokens and bump offset.
			markerOffset++;
		} else {
			// normal mode -- remove first token
			queue.removeFirst();
		}
		numToConsume--;
	}
}